

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# placalc.cpp
# Opt level: O2

void placalc::doit(float relativeSecondaryFactor,float absoluteFactor)

{
  bool bVar1;
  size_t sVar2;
  iterator iVar3;
  uint uVar4;
  int sampleSize;
  gulSampleslevelRec gr;
  int gulstreamType;
  float local_68;
  gulSampleslevelHeader gh;
  event_amplification ea;
  
  local_68 = absoluteFactor;
  LoadItemToAmplification();
  if ((local_68 == 0.0) && (!NAN(local_68))) {
    LoadPostLossAmplificationFactors(relativeSecondaryFactor);
  }
  gulstreamType = 0;
  fread(&gulstreamType,4,1,_stdin);
  uVar4 = 0x1000000;
  if (((uint)gulstreamType >> 0x18 & 1) == 0) {
    uVar4 = gulstreamType & 0x2000000;
  }
  if ((uVar4 != 0x1000000) && (uVar4 != 0x2000000)) {
    fprintf(_stderr,"FATAL: placalc: %s: Not a valid gul stream type %d\n","doit");
    exit(1);
  }
  fwrite(&gulstreamType,4,1,_stdout);
  sampleSize = 0;
  sVar2 = fread(&sampleSize,4,1,_stdin);
  if (sVar2 == 0) {
    fprintf(_stderr,"FATAL: placalc: %s: Invalid sample size %d\n","doit",(ulong)(uint)sampleSize);
  }
  fwrite(&sampleSize,4,1,_stdout);
  bVar1 = local_68 == 0.0;
  uVar4 = ~-(uint)bVar1 & (uint)local_68;
  do {
    if (sVar2 == 0) {
      return;
    }
    sVar2 = fread(&gh,8,1,_stdin);
    if (sVar2 == 0) {
      return;
    }
    fwrite(&gh,8,1,_stdout);
    ea.event_id = gh.event_id;
    ea.amplification_id = *(int *)(item_to_amplification_ + (long)gh.item_id * 4);
    iVar3 = std::
            _Hashtable<event_amplification,_std::pair<const_event_amplification,_float>,_std::allocator<std::pair<const_event_amplification,_float>_>,_std::__detail::_Select1st,_std::equal_to<event_amplification>,_placalc::hash_event_amplification,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<event_amplification,_std::pair<const_event_amplification,_float>,_std::allocator<std::pair<const_event_amplification,_float>_>,_std::__detail::_Select1st,_std::equal_to<event_amplification>,_placalc::hash_event_amplification,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)factors_,&ea);
    local_68 = (float)(uVar4 | -(uint)bVar1 & 0x3f800000);
    if (iVar3.super__Node_iterator_base<std::pair<const_event_amplification,_float>,_true>._M_cur !=
        (__node_type *)0x0) {
      local_68 = *(float *)((long)iVar3.
                                  super__Node_iterator_base<std::pair<const_event_amplification,_float>,_true>
                                  ._M_cur + 0x10);
    }
    do {
      sVar2 = fread(&gr,8,1,_stdin);
      if (sVar2 == 0) break;
      gr.loss = gr.loss * local_68;
      fwrite(&gr,8,1,_stdout);
    } while (gr.sidx != 0);
  } while( true );
}

Assistant:

void doit(const float relativeSecondaryFactor,
	    const float absoluteFactor) {

    LoadItemToAmplification();
    // Ignore loss factors file if absolute factor is specified
    if (absoluteFactor == 0.0) {
      LoadPostLossAmplificationFactors(relativeSecondaryFactor);
    }

    // Check input stream type is GUL item stream or loss stream and write type
    // to output
    int gulstreamType = 0;
    size_t i = fread(&gulstreamType, sizeof(gulstreamType), 1, stdin);
    int streamType = gulstreamType & gulstream_id;
    if (streamType == 0) {
      streamType = gulstreamType & loss_stream_id;
    }
    if (streamType != gulstream_id && streamType != loss_stream_id) {
      fprintf(stderr, "FATAL: placalc: %s: Not a valid gul stream type %d\n",
	      __func__, gulstreamType);
      exit(EXIT_FAILURE);
    }
    fwrite(&gulstreamType, sizeof(gulstreamType), 1, stdout);

    // Read in number of samples and write to output
    int sampleSize = 0;
    i = fread(&sampleSize, sizeof(sampleSize), 1, stdin);
    if (i == 0) {
      fprintf(stderr, "FATAL: placalc: %s: Invalid sample size %d\n", __func__,
	      sampleSize);
    }
    fwrite(&sampleSize, sizeof(sampleSize), 1, stdout);

    // Default factor is 1.0 or absolute factor given by user
    const float defaultFactor = (absoluteFactor == 0.0) ? 1.0 : absoluteFactor;

    // Read in data from GUL stream, apply Post Loss Amplification (PLA) factors
    // and write out to standard output
    while (i != 0) {
      event_amplification ea;
      gulSampleslevelHeader gh;
      i = fread(&gh, sizeof(gh), 1, stdin);
      if (i == 0) break;

      fwrite(&gh, sizeof(gh), 1, stdout);
      ea.event_id = gh.event_id;
      ea.amplification_id = item_to_amplification_[gh.item_id];
      // Default factor is used if post loss amplification factor is not present
      float factor = defaultFactor;
      auto iter = factors_.find(ea);
      if (iter != factors_.end()) factor = iter->second;

      gulSampleslevelRec gr;
      while ((i = fread(&gr, sizeof(gr), 1, stdin)) != 0) {
	gr.loss *= factor;
	fwrite(&gr, sizeof(gr), 1, stdout);
	if (gr.sidx == 0) break;
      }
    }

  }